

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArraySortMethod::checkArguments
          (ArraySortMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  reference ppEVar3;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  SystemSubroutine *in_RSI;
  SourceLocation in_RDI;
  long in_R9;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  Type *elemType;
  Compilation *comp;
  string *arg;
  Diagnostic *this_01;
  Type *in_stack_ffffffffffffff68;
  ASTContext *in_stack_ffffffffffffff78;
  ASTContext *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode DVar5;
  Type *local_8;
  
  DVar5 = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  this_00 = ASTContext::getCompilation((ASTContext *)0x8afd7b);
  arg = (string *)0x0;
  this_01 = (Diagnostic *)0x0;
  callRange.endLoc = in_RCX;
  callRange.startLoc = in_RDI;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RSI,in_RDX,SUB81((ulong)in_R9 >> 0x38,0),(Args *)this_00,callRange,
                     unaff_retaddr,in_stack_00000008);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
    bVar1 = SystemSubroutine::registerLValue
                      ((Expression *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff80);
    if (bVar1) {
      if (in_R9 == 0) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x8afed0);
        pTVar2 = Type::getArrayElementType(in_stack_ffffffffffffff68);
        DVar5 = SUB84((ulong)pTVar2 >> 0x20,0);
        bVar1 = isComparable((Type *)this_01);
        if (!bVar1) {
          uVar4 = 0x1000b;
          ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                    operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                               in_RDX,0);
          sourceRange_00.endLoc._0_4_ = in_stack_ffffffffffffff88;
          sourceRange_00.startLoc = ((*ppEVar3)->sourceRange).endLoc;
          sourceRange_00.endLoc._4_4_ = uVar4;
          ASTContext::addDiag((ASTContext *)((*ppEVar3)->sourceRange).startLoc,DVar5,sourceRange_00)
          ;
          Diagnostic::operator<<(this_01,arg);
          pTVar2 = Compilation::getErrorType(this_00);
          return pTVar2;
        }
      }
      else {
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x8afe41);
        bVar1 = isComparable((Type *)this_01);
        if (!bVar1) {
          sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff88;
          sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffff80;
          sourceRange.endLoc._4_4_ = in_stack_ffffffffffffff8c;
          ASTContext::addDiag(in_stack_ffffffffffffff78,DVar5,sourceRange);
          Diagnostic::operator<<(this_01,arg);
          pTVar2 = Compilation::getErrorType(this_00);
          return pTVar2;
        }
      }
      local_8 = Compilation::getVoidType(this_00);
    }
    else {
      local_8 = Compilation::getErrorType(this_00);
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        if (iterExpr) {
            if (!isComparable(*iterExpr->type)) {
                context.addDiag(diag::ArrayMethodComparable, iterExpr->sourceRange) << name;
                return comp.getErrorType();
            }
        }
        else {
            auto elemType = args[0]->type->getArrayElementType();
            SLANG_ASSERT(elemType);

            if (!isComparable(*elemType)) {
                context.addDiag(diag::ArrayMethodComparable, args[0]->sourceRange) << name;
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }